

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O0

Node * mainposition(Table *t,TValue *key)

{
  Node *pNVar1;
  uint uVar2;
  TValue *key_local;
  Table *t_local;
  
  switch(key->tt_ & 0x7f) {
  case 1:
    if (key->tt_ != 1) {
      __assert_fail("((((key))->tt_) == (1))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                    ,0x70,"Node *mainposition(const Table *, const TValue *)");
    }
    t_local = (Table *)(t->node + ((key->value_).b & t->hmask));
    break;
  case 2:
    if (key->tt_ != 2) {
      __assert_fail("((((key))->tt_) == (2))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                    ,0x72,"Node *mainposition(const Table *, const TValue *)");
    }
    t_local = (Table *)(t->node + ((key->value_).i & 0xffffffffU) % (ulong)(t->hmask | 1));
    break;
  case 3:
    pNVar1 = t->node;
    if (key->tt_ != 3) {
      __assert_fail("((((key))->tt_) == (((3) | ((0) << 4))))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                    ,0x6a,"Node *mainposition(const Table *, const TValue *)");
    }
    uVar2 = l_hashfloat((key->value_).n);
    t_local = (Table *)(pNVar1 + (ulong)uVar2 % (ulong)(t->hmask | 1));
    break;
  case 4:
    if ((key->tt_ & 0xf) != 4) {
      __assert_fail("(((((((key))->tt_)) & 0x0F)) == (4))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                    ,0x6c,"Node *mainposition(const Table *, const TValue *)");
    }
    if ((((key->value_).gc)->tt & 0xf) != 4) {
      __assert_fail("(((((key)->value_).gc)->tt) & 0x0F) == 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                    ,0x6c,"Node *mainposition(const Table *, const TValue *)");
    }
    t_local = (Table *)(t->node + (*(uint *)((key->value_).f + 0xc) & t->hmask));
    break;
  default:
    if (key->tt_ == 10) {
      __assert_fail("!((((key))->tt_) == ((9+1)))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                    ,0x78,"Node *mainposition(const Table *, const TValue *)");
    }
    if ((key->tt_ & 0x8000) == 0) {
      __assert_fail("(((key)->tt_) & (1 << 15))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                    ,0x79,"Node *mainposition(const Table *, const TValue *)");
    }
    t_local = (Table *)(t->node + ((key->value_).i & 0xffffffffU) % (ulong)(t->hmask | 1));
    break;
  case 0x13:
    if (key->tt_ != 0x13) {
      __assert_fail("((((key))->tt_) == (((3) | ((1) << 4))))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                    ,0x68,"Node *mainposition(const Table *, const TValue *)");
    }
    t_local = (Table *)(t->node + ((key->value_).i & (ulong)t->hmask));
    break;
  case 0x14:
    pNVar1 = t->node;
    if ((key->tt_ & 0xf) != 4) {
      __assert_fail("(((((((key))->tt_)) & 0x0F)) == (4))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                    ,0x6e,"Node *mainposition(const Table *, const TValue *)");
    }
    if ((((key->value_).gc)->tt & 0xf) != 4) {
      __assert_fail("(((((key)->value_).gc)->tt) & 0x0F) == 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                    ,0x6e,"Node *mainposition(const Table *, const TValue *)");
    }
    uVar2 = luaS_hashlongstr((TString *)(key->value_).gc);
    t_local = (Table *)(pNVar1 + (uVar2 & t->hmask));
    break;
  case 0x16:
    if (key->tt_ != 0x16) {
      __assert_fail("((((key))->tt_) == (((6) | ((1) << 4))))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                    ,0x74,"Node *mainposition(const Table *, const TValue *)");
    }
    t_local = (Table *)(t->node + ((key->value_).i & 0xffffffffU) % (ulong)(t->hmask | 1));
    break;
  case 0x46:
    if ((key->tt_ & 0x7f) != 0x46) {
      __assert_fail("((((key)->tt_) & 0x7F) == ((6) | ((4) << 4)))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                    ,0x76,"Node *mainposition(const Table *, const TValue *)");
    }
    t_local = (Table *)(t->node + ((key->value_).i & 0xffffffffU) % (ulong)(t->hmask | 1));
  }
  return (Node *)t_local;
}

Assistant:

static Node *mainposition (const Table *t, const TValue *key) {
  switch (ttype(key)) {
    case LUA_TNUMINT:
      return hashint(t, ivalue(key));
    case LUA_TNUMFLT:
      return hashmod(t, l_hashfloat(fltvalue(key)));
    case LUA_TSHRSTR:
      return hashstr(t, tsvalue(key));
    case LUA_TLNGSTR:
      return hashpow2(t, luaS_hashlongstr(tsvalue(key)));
    case LUA_TBOOLEAN:
      return hashboolean(t, bvalue(key));
    case LUA_TLIGHTUSERDATA:
      return hashpointer(t, pvalue(key));
    case LUA_TLCF:
      return hashpointer(t, fvalue(key));
    case RAVI_TFCF:
      return hashpointer(t, fcfvalue(key));
    default:
      lua_assert(!ttisdeadkey(key));
      return hashpointer(t, gcvalue(key));
  }
}